

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_algorithms.hpp
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 boost::xpressive::detail::
 regex_replace_impl<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           end,basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *re,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format,
           match_flag_type flags)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar4;
  const_reference pvVar5;
  short sVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  what;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  state;
  match_results local_198;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  
  local_198.nested_results_.
  super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._sentry._prev = (node_base *)&local_198.nested_results_;
  local_198.prefix_.super_type.m_initialized = false;
  local_198.suffix_.super_type.m_initialized = false;
  local_198.regex_id_ = (regex_id_type)0x0;
  local_198.sub_matches_.size_._0_1_ = 0;
  local_198.sub_matches_.size_._1_7_ = 0;
  local_198.sub_matches_.sub_matches_._0_1_ = 0;
  local_198._17_8_ = 0;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198.extras_ptr_.px =
       (results_extras<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_198.traits_.px = (traits<char> *)0x0;
  local_198.args_._M_t._M_impl._0_8_ = 0;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_198.named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.named_marks_.
  super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.nested_results_.
  super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._sentry._next =
       local_198.nested_results_.
       super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._sentry._prev;
  local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198.args_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar4 = tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::get((tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)re);
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::match_state(&local_c8,begin,end,&local_198,psVar4->px,flags);
  bVar3 = regex_search_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_c8,re,false);
  sVar6 = (short)flags;
  _Var7._M_current = begin._M_current;
  if (bVar3) {
    if (-1 < sVar6) {
      pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_198.sub_matches_,0);
      lVar8 = (long)(pvVar5->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).first._M_current - (long)begin._M_current;
      if (0 < lVar8) {
        lVar8 = lVar8 + 1;
        do {
          std::__cxx11::string::push_back((char)out.container);
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
    }
    out = match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
          format_<std::back_insert_iterator<std::__cxx11::string>,std::__cxx11::string>
                    ((match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      *)&local_198,out.container,format,flags);
    pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_198.sub_matches_,0);
    _Var7._M_current =
         (pvVar5->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).second._M_current;
    local_c8.cur_._M_current = _Var7._M_current;
    local_c8.next_search_._M_current = _Var7._M_current;
    if ((flags >> 0x10 & 1) == 0) {
      pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_198.sub_matches_,0);
      bVar3 = pvVar5->matched;
      pcVar1 = (pvVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
      pcVar2 = (pvVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current;
      psVar4 = tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::get((tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)re);
      match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset(&local_c8,&local_198,psVar4->px);
      lVar8 = (long)pcVar2 - (long)pcVar1;
      if (bVar3 == false) {
        lVar8 = 0;
      }
      while (bVar3 = regex_search_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                               (&local_c8,re,lVar8 == 0), bVar3) {
        if (-1 < sVar6) {
          pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_198.sub_matches_,0);
          lVar8 = (long)(pvVar5->
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).first._M_current - (long)_Var7._M_current;
          if (0 < lVar8) {
            lVar8 = lVar8 + 1;
            do {
              std::__cxx11::string::push_back((char)out.container);
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
        }
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set_prefix_suffix_(&local_198,begin,end);
        out = match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
              format_<std::back_insert_iterator<std::__cxx11::string>,std::__cxx11::string>
                        ((match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          *)&local_198,out.container,format,flags);
        pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_198.sub_matches_,0);
        _Var7._M_current =
             (pvVar5->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).second._M_current;
        local_c8.cur_._M_current = _Var7._M_current;
        local_c8.next_search_._M_current = _Var7._M_current;
        pvVar5 = sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_198.sub_matches_,0);
        bVar3 = pvVar5->matched;
        pcVar1 = (pvVar5->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pcVar2 = (pvVar5->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current;
        psVar4 = tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::get((tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)re);
        lVar8 = (long)pcVar2 - (long)pcVar1;
        if (bVar3 == false) {
          lVar8 = 0;
        }
        match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reset(&local_c8,&local_198,psVar4->px);
      }
    }
  }
  if ((-1 < sVar6) && (0 < (long)end._M_current - (long)_Var7._M_current)) {
    lVar8 = ((long)end._M_current - (long)_Var7._M_current) + 1;
    do {
      std::__cxx11::string::push_back((char)out.container);
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~match_results(&local_198);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

inline OutIter regex_replace_impl
    (
        OutIter out
      , BidiIter begin
      , BidiIter end
      , basic_regex<BidiIter> const &re
      , Formatter const &format
      , regex_constants::match_flag_type flags = regex_constants::match_default
    )
    {
        using namespace regex_constants;
        typedef detail::core_access<BidiIter> access;
        BOOST_ASSERT(0 != re.regex_id());

        BidiIter cur = begin;
        match_results<BidiIter> what;
        detail::match_state<BidiIter> state(begin, end, what, *access::get_regex_impl(re), flags);
        bool const yes_copy = (0 == (flags & format_no_copy));

        if(detail::regex_search_impl(state, re))
        {
            if(yes_copy)
            {
                out = std::copy(cur, what[0].first, out);
            }

            out = what.format(out, format, flags);
            cur = state.cur_ = state.next_search_ = what[0].second;

            if(0 == (flags & format_first_only))
            {
                bool not_null = (0 == what.length());
                state.reset(what, *access::get_regex_impl(re));
                while(detail::regex_search_impl(state, re, not_null))
                {
                    if(yes_copy)
                    {
                        out = std::copy(cur, what[0].first, out);
                    }

                    access::set_prefix_suffix(what, begin, end);
                    out = what.format(out, format, flags);
                    cur = state.cur_ = state.next_search_ = what[0].second;
                    not_null = (0 == what.length());
                    state.reset(what, *access::get_regex_impl(re));
                }
            }
        }

        if(yes_copy)
        {
            out = std::copy(cur, end, out);
        }

        return out;
    }